

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileselector_p.h
# Opt level: O0

void __thiscall QFileSelectorPrivate::~QFileSelectorPrivate(QFileSelectorPrivate *this)

{
  QFileSelectorPrivate *in_RDI;
  
  ~QFileSelectorPrivate(in_RDI);
  operator_delete(in_RDI,0x90);
  return;
}

Assistant:

class Q_CORE_EXPORT QFileSelectorPrivate : QObjectPrivate //Exported for use in other modules (like QtGui)
{
    Q_DECLARE_PUBLIC(QFileSelector)
public:
    static void updateSelectors();
    static QStringList platformSelectors();
    static void addStatics(const QStringList &); //For loading GUI statics from other Qt modules
    static QString selectionHelper(const QString &path, const QString &fileName,
                                   const QStringList &selectors, QChar indicator = u'+');
    QFileSelectorPrivate();
    QString select(const QString &filePath) const;

    QStringList extras;
}